

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O2

void __thiscall hrvo::Agent::Agent(Agent *this,Simulator *simulator,Vector2 *position,size_t goalNo)

{
  _Rb_tree_header *p_Var1;
  Agent *pAVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  this->simulator_ = simulator;
  this->newVelocity_ = simulator->defaults_->velocity_;
  this->position_ = *position;
  Vector2::Vector2(&this->prefVelocity_);
  this->velocity_ = this->simulator_->defaults_->velocity_;
  this->goalNo_ = goalNo;
  pAVar2 = this->simulator_->defaults_;
  this->maxNeighbors_ = pAVar2->maxNeighbors_;
  fVar3 = pAVar2->maxAccel_;
  fVar4 = pAVar2->maxSpeed_;
  fVar5 = pAVar2->neighborDist_;
  this->goalRadius_ = pAVar2->goalRadius_;
  this->maxAccel_ = fVar3;
  this->maxSpeed_ = fVar4;
  this->neighborDist_ = fVar5;
  fVar3 = pAVar2->prefSpeed_;
  fVar4 = pAVar2->radius_;
  fVar5 = pAVar2->uncertaintyOffset_;
  this->orientation_ = pAVar2->orientation_;
  this->prefSpeed_ = fVar3;
  this->radius_ = fVar4;
  this->uncertaintyOffset_ = fVar5;
  this->reachedGoal_ = false;
  p_Var1 = &(this->candidates_)._M_t._M_impl.super__Rb_tree_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->neighbors_)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

Agent::Agent(Simulator *simulator, const Vector2 &position, std::size_t goalNo)
    : simulator_(simulator),
      newVelocity_(simulator_->defaults_->velocity_),
      position_(position),
      velocity_(simulator_->defaults_->velocity_),
      goalNo_(goalNo),
      maxNeighbors_(simulator_->defaults_->maxNeighbors_),
      goalRadius_(simulator_->defaults_->goalRadius_),
      maxAccel_(simulator_->defaults_->maxAccel_),
      maxSpeed_(simulator_->defaults_->maxSpeed_),
      neighborDist_(simulator_->defaults_->neighborDist_),
      orientation_(simulator_->defaults_->orientation_),
      prefSpeed_(simulator_->defaults_->prefSpeed_),
      radius_(simulator_->defaults_->radius_),
      uncertaintyOffset_(simulator_->defaults_->uncertaintyOffset_),
#if HRVO_DIFFERENTIAL_DRIVE
      leftWheelSpeed_(0.0F),
      rightWheelSpeed_(0.0F),
      timeToOrientation_(simulator_->defaults_->timeToOrientation_),
      wheelTrack_(simulator_->defaults_->wheelTrack_),
#endif /* HRVO_DIFFERENTIAL_DRIVE */
      reachedGoal_(false) {
#if HRVO_DIFFERENTIAL_DRIVE
  computeWheelSpeeds();
#endif /* HRVO_DIFFERENTIAL_DRIVE */
}